

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_itrans_recon.c
# Opt level: O2

void ihevc_itrans_recon_4x4
               (WORD16 *pi2_src,WORD16 *pi2_tmp,UWORD8 *pu1_pred,UWORD8 *pu1_dst,WORD32 src_strd,
               WORD32 pred_strd,WORD32 dst_strd,WORD32 zero_cols,WORD32 zero_rows)

{
  WORD16 *pWVar1;
  UWORD8 *pUVar2;
  byte *pbVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  
  for (lVar7 = 0; (int)lVar7 != 0x10; lVar7 = lVar7 + 4) {
    if ((zero_cols & 1U) == 0) {
      iVar4 = pi2_src[src_strd * 3] * 0x24 + pi2_src[src_strd] * 0x53;
      iVar6 = pi2_src[src_strd * 2] * 0x40 + *pi2_src * 0x40;
      iVar5 = iVar4 + iVar6 + 0x40 >> 7;
      if (iVar5 < -0x7fff) {
        iVar5 = -0x8000;
      }
      if (0x7ffe < iVar5) {
        iVar5 = 0x7fff;
      }
      iVar9 = pi2_src[src_strd * 3] * -0x53 + pi2_src[src_strd] * 0x24;
      iVar8 = pi2_src[src_strd * 2] * -0x40 + *pi2_src * 0x40;
      pi2_tmp[lVar7] = (WORD16)iVar5;
      iVar5 = iVar9 + iVar8 + 0x40 >> 7;
      if (iVar5 < -0x7fff) {
        iVar5 = -0x8000;
      }
      if (0x7ffe < iVar5) {
        iVar5 = 0x7fff;
      }
      pi2_tmp[lVar7 + 1] = (WORD16)iVar5;
      iVar5 = (iVar8 - iVar9) + 0x40 >> 7;
      if (iVar5 < -0x7fff) {
        iVar5 = -0x8000;
      }
      if (0x7ffe < iVar5) {
        iVar5 = 0x7fff;
      }
      pi2_tmp[lVar7 + 2] = (WORD16)iVar5;
      iVar5 = (iVar6 - iVar4) + 0x40 >> 7;
      if (iVar5 < -0x7fff) {
        iVar5 = -0x8000;
      }
      if (0x7ffe < iVar5) {
        iVar5 = 0x7fff;
      }
      pi2_tmp[lVar7 + 3] = (WORD16)iVar5;
    }
    else {
      pWVar1 = pi2_tmp + lVar7;
      pWVar1[0] = 0;
      pWVar1[1] = 0;
      pWVar1[2] = 0;
      pWVar1[3] = 0;
    }
    pi2_src = pi2_src + 1;
    zero_cols = zero_cols >> 1;
  }
  pUVar2 = pu1_dst + 3;
  pbVar3 = pu1_pred + 3;
  for (lVar7 = 0; (int)lVar7 != 4; lVar7 = lVar7 + 1) {
    iVar6 = pi2_tmp[lVar7 + 0xc] * 0x24 + pi2_tmp[lVar7 + 4] * 0x53;
    iVar4 = pi2_tmp[lVar7 + 8] * 0x40 + pi2_tmp[lVar7] * 0x40;
    iVar5 = iVar6 + iVar4 + 0x800 >> 0xc;
    if (iVar5 < -0x7fff) {
      iVar5 = -0x8000;
    }
    if (0x7ffe < iVar5) {
      iVar5 = 0x7fff;
    }
    iVar5 = (uint)pbVar3[-3] + iVar5;
    if (iVar5 < 1) {
      iVar5 = 0;
    }
    if (0xfe < iVar5) {
      iVar5 = 0xff;
    }
    iVar9 = pi2_tmp[lVar7 + 0xc] * -0x53 + pi2_tmp[lVar7 + 4] * 0x24;
    iVar8 = pi2_tmp[lVar7 + 8] * -0x40 + pi2_tmp[lVar7] * 0x40;
    pUVar2[-3] = (UWORD8)iVar5;
    iVar5 = iVar9 + iVar8 + 0x800 >> 0xc;
    if (iVar5 < -0x7fff) {
      iVar5 = -0x8000;
    }
    if (0x7ffe < iVar5) {
      iVar5 = 0x7fff;
    }
    iVar5 = (uint)pbVar3[-2] + iVar5;
    if (iVar5 < 1) {
      iVar5 = 0;
    }
    if (0xfe < iVar5) {
      iVar5 = 0xff;
    }
    pUVar2[-2] = (UWORD8)iVar5;
    iVar5 = (iVar8 - iVar9) + 0x800 >> 0xc;
    if (iVar5 < -0x7fff) {
      iVar5 = -0x8000;
    }
    if (0x7ffe < iVar5) {
      iVar5 = 0x7fff;
    }
    iVar5 = (uint)pbVar3[-1] + iVar5;
    if (iVar5 < 1) {
      iVar5 = 0;
    }
    if (0xfe < iVar5) {
      iVar5 = 0xff;
    }
    pUVar2[-1] = (UWORD8)iVar5;
    iVar5 = (iVar4 - iVar6) + 0x800 >> 0xc;
    if (iVar5 < -0x7fff) {
      iVar5 = -0x8000;
    }
    if (0x7ffe < iVar5) {
      iVar5 = 0x7fff;
    }
    iVar5 = (uint)*pbVar3 + iVar5;
    if (iVar5 < 1) {
      iVar5 = 0;
    }
    if (0xfe < iVar5) {
      iVar5 = 0xff;
    }
    *pUVar2 = (UWORD8)iVar5;
    pUVar2 = pUVar2 + dst_strd;
    pbVar3 = pbVar3 + pred_strd;
  }
  return;
}

Assistant:

void ihevc_itrans_recon_4x4(WORD16 *pi2_src,
                            WORD16 *pi2_tmp,
                            UWORD8 *pu1_pred,
                            UWORD8 *pu1_dst,
                            WORD32 src_strd,
                            WORD32 pred_strd,
                            WORD32 dst_strd,
                            WORD32 zero_cols,
                            WORD32 zero_rows)

{
    WORD32 j;
    WORD32 e[2], o[2];
    WORD32 add;
    WORD32 shift;
    WORD16 *pi2_tmp_orig;
    WORD32 trans_size;
    UNUSED(zero_rows);
    trans_size = TRANS_SIZE_4;

    pi2_tmp_orig = pi2_tmp;

    /* Inverse Transform 1st stage */
    shift = IT_SHIFT_STAGE_1;
    add = 1 << (shift - 1);

    for(j = 0; j < trans_size; j++)
    {
        /* Checking for Zero Cols */
        if((zero_cols & 1) == 1)
        {
            memset(pi2_tmp, 0, trans_size * sizeof(WORD16));
        }
        else
        {

            /* Utilizing symmetry properties to the maximum to minimize the number of multiplications */
            o[0] = g_ai2_ihevc_trans_4[1][0] * pi2_src[src_strd]
                            + g_ai2_ihevc_trans_4[3][0] * pi2_src[3 * src_strd];
            o[1] = g_ai2_ihevc_trans_4[1][1] * pi2_src[src_strd]
                            + g_ai2_ihevc_trans_4[3][1] * pi2_src[3 * src_strd];
            e[0] = g_ai2_ihevc_trans_4[0][0] * pi2_src[0]
                            + g_ai2_ihevc_trans_4[2][0] * pi2_src[2 * src_strd];
            e[1] = g_ai2_ihevc_trans_4[0][1] * pi2_src[0]
                            + g_ai2_ihevc_trans_4[2][1] * pi2_src[2 * src_strd];

            pi2_tmp[0] =
                            CLIP_S16(((e[0] + o[0] + add) >> shift));
            pi2_tmp[1] =
                            CLIP_S16(((e[1] + o[1] + add) >> shift));
            pi2_tmp[2] =
                            CLIP_S16(((e[1] - o[1] + add) >> shift));
            pi2_tmp[3] =
                            CLIP_S16(((e[0] - o[0] + add) >> shift));

        }
        pi2_src++;
        pi2_tmp += trans_size;
        zero_cols = zero_cols >> 1;
    }

    pi2_tmp = pi2_tmp_orig;

    /* Inverse Transform 2nd stage */
    shift = IT_SHIFT_STAGE_2;
    add = 1 << (shift - 1);

    for(j = 0; j < trans_size; j++)
    {
        WORD32 itrans_out;
        /* Utilizing symmetry properties to the maximum to minimize the number of multiplications */
        o[0] = g_ai2_ihevc_trans_4[1][0] * pi2_tmp[trans_size]
                        + g_ai2_ihevc_trans_4[3][0] * pi2_tmp[3 * trans_size];
        o[1] = g_ai2_ihevc_trans_4[1][1] * pi2_tmp[trans_size]
                        + g_ai2_ihevc_trans_4[3][1] * pi2_tmp[3 * trans_size];
        e[0] = g_ai2_ihevc_trans_4[0][0] * pi2_tmp[0]
                        + g_ai2_ihevc_trans_4[2][0] * pi2_tmp[2 * trans_size];
        e[1] = g_ai2_ihevc_trans_4[0][1] * pi2_tmp[0]
                        + g_ai2_ihevc_trans_4[2][1] * pi2_tmp[2 * trans_size];

        itrans_out =
                        CLIP_S16(((e[0] + o[0] + add) >> shift));
        pu1_dst[0] = CLIP_U8((itrans_out + pu1_pred[0]));
        itrans_out =
                        CLIP_S16(((e[1] + o[1] + add) >> shift));
        pu1_dst[1] = CLIP_U8((itrans_out + pu1_pred[1]));
        itrans_out =
                        CLIP_S16(((e[1] - o[1] + add) >> shift));
        pu1_dst[2] = CLIP_U8((itrans_out + pu1_pred[2]));
        itrans_out =
                        CLIP_S16(((e[0] - o[0] + add) >> shift));
        pu1_dst[3] = CLIP_U8((itrans_out + pu1_pred[3]));

        pi2_tmp++;
        pu1_pred += pred_strd;
        pu1_dst += dst_strd;

    }
}